

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cc
# Opt level: O2

string * load_string_abi_cxx11_
                   (string *__return_storage_ptr__,bool use_colors,bool use_powerline_left,
                   bool use_powerline_right,short num_averages)

{
  double dVar1;
  undefined8 uVar2;
  long lVar3;
  POWERLINE_DIRECTION PVar4;
  int iVar5;
  uint32_t uVar6;
  ulong uVar7;
  ostream *poVar8;
  undefined7 in_register_00000009;
  POWERLINE_DIRECTION direction;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  char (*color) [32];
  undefined2 in_register_00000082;
  uint __nelem;
  double *__loadavg;
  ulong uVar9;
  double *pdVar10;
  float fVar11;
  ulong uStack_1e0;
  double dStack_1d8;
  long local_1d0;
  ostringstream ss;
  uint auStack_1b8 [88];
  undefined1 *local_58;
  ulong local_50;
  undefined4 local_44;
  string *local_40;
  undefined4 local_38;
  POWERLINE_DIRECTION local_34;
  
  __nelem = CONCAT22(in_register_00000082,num_averages);
  pdVar10 = &dStack_1d8;
  local_34 = (POWERLINE_DIRECTION)CONCAT71(in_register_00000011,use_powerline_left);
  local_38 = (undefined4)CONCAT71(in_register_00000031,use_colors);
  uStack_1e0 = 0x103736;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
  *(uint *)((long)auStack_1b8 + *(long *)(local_1d0 + -0x18)) =
       *(uint *)((long)auStack_1b8 + *(long *)(local_1d0 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&ss + *(long *)(local_1d0 + -0x18)) = 2;
  lVar3 = -(ulong)((uint)(ushort)num_averages * 8 + 0xf & 0xfffffff0);
  __loadavg = (double *)((long)&dStack_1d8 + lVar3);
  if ((ushort)(num_averages - 4U) < 0xfffd) {
    *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x103795;
    std::operator<<((ostream *)&local_1d0,'\0');
    pdVar10 = &dStack_1d8;
  }
  else {
    *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x1037a5;
    iVar5 = getloadavg(__loadavg,__nelem);
    if (iVar5 < 0) {
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x103913;
      std::operator<<((ostream *)&local_1d0," 0.00 0.00 0.00");
    }
    else {
      local_40 = (string *)*__loadavg;
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x1037bd;
      uVar6 = get_cpu_count();
      uVar7 = (ulong)(((double)local_40 / (double)uVar6) * 0.5 * 100.0);
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 100;
      PVar4 = local_34;
      uVar9 = *(ulong *)((long)&uStack_1e0 + lVar3);
      if ((uint)uVar7 < 100) {
        uVar9 = uVar7;
      }
      local_50 = uVar9 & 0xffffffff;
      if ((char)local_38 != '\0') {
        *(undefined8 *)((long)&uStack_1e0 + lVar3) = 2;
        direction = (POWERLINE_DIRECTION)*(undefined8 *)((long)&uStack_1e0 + lVar3);
        if (!use_powerline_right) {
          direction = PVar4 & 0xff;
        }
        *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x103824;
        powerline((ostringstream *)&local_1d0,load_lut[uVar9 & 0xffffffff],direction,false);
      }
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x20;
      uVar2 = *(undefined8 *)((long)&uStack_1e0 + lVar3);
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x103833;
      std::operator<<((ostream *)&local_1d0,(char)uVar2);
      local_44 = (int)CONCAT71(in_register_00000009,use_powerline_right);
      local_58 = (undefined1 *)&dStack_1d8;
      local_40 = __return_storage_ptr__;
      for (uVar9 = 0; __return_storage_ptr__ = local_40, pdVar10 = (double *)local_58,
          __nelem != uVar9; uVar9 = uVar9 + 1) {
        dVar1 = __loadavg[uVar9];
        *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x103875;
        fVar11 = floorf((float)dVar1 * 100.0 + 0.5);
        if (__nelem - 1 == uVar9) {
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x10388a;
          std::ostream::operator<<(&local_1d0,fVar11 / 100.0);
        }
        else {
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x103894;
          poVar8 = (ostream *)std::ostream::operator<<(&local_1d0,fVar11 / 100.0);
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x1038a3;
          std::operator<<(poVar8," ");
        }
      }
      if ((char)local_38 != '\0') {
        if ((undefined1)local_34 == '\0') {
          if ((char)local_44 == '\0') {
            *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x10395a;
            std::operator<<((ostream *)&local_1d0,"#[fg=default,bg=default]");
          }
        }
        else {
          color = load_lut + local_50;
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 1;
          uVar2 = *(undefined8 *)((long)&uStack_1e0 + lVar3);
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x1038e6;
          powerline((ostringstream *)&local_1d0,*color,(POWERLINE_DIRECTION)uVar2,SUB81(uVar2,0));
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 1;
          uVar2 = *(undefined8 *)((long)&uStack_1e0 + lVar3);
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x1038fe;
          powerline((ostringstream *)&local_1d0,"#[fg=default,bg=default]",
                    (POWERLINE_DIRECTION)uVar2,false);
        }
      }
    }
  }
  *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x103922;
  std::__cxx11::stringbuf::str();
  *(undefined8 *)((long)pdVar10 + -8) = 0x103931;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
  return __return_storage_ptr__;
}

Assistant:

std::string load_string( bool use_colors,
  bool use_powerline_left, bool use_powerline_right,
  short num_averages )
{
  std::ostringstream ss;
  ss.setf( std::ios::fixed, std::ios::floatfield );
  ss.precision( 2 );
  double averages[num_averages];
  // based on: opensource.apple.com/source/Libc/Libc-262/gen/getloadavg.c

  if( num_averages <= 0 || num_averages > 3)
  {
    ss << (char) 0;
    return ss.str();
  }

  if( getloadavg( averages, num_averages ) < 0 )
  {
    ss << " 0.00 0.00 0.00"; // couldn't get averages.
  }
  else
  {
    unsigned load_percent = static_cast<unsigned int>( averages[0] /
        get_cpu_count() * 0.5f * 100.0f );

    if( load_percent > 100 )
    {
      load_percent = 100;
    }
    if( use_colors )
    {
      if( use_powerline_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_RIGHT );
      }
      else if( use_powerline_left )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT );
      }
      else
      {
        powerline( ss, load_lut[load_percent], NONE );
      }
    }

    ss << ' ';
    for( int i = 0; i < num_averages; ++i )
    {
      // Round to nearest, make sure this is only a 0.00 value not a 0.0000
      float avg = floorf( static_cast<float>( averages[i] ) * 100 + 0.5 ) / 100;
      // Don't print trailing whitespace for last element
      if ( i == num_averages-1 )
      {
        ss << avg;
      }
      else
      {
        ss << avg << " ";
      }
    }

    if( use_colors )
    {
      if( use_powerline_left )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT, true );
        powerline( ss, "#[fg=default,bg=default]", POWERLINE_LEFT );
      }
      else if( !use_powerline_right )
      {
        ss << "#[fg=default,bg=default]";
      }
    }
  }

  return ss.str();
}